

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O0

void storeRGBX16FFromRGBA32F_avx2
               (uchar *dest,QRgbaFloat32 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  undefined1 auVar1 [16];
  QRgbaFloat32 QVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  QRgbaFloat32 *pQVar9;
  QRgbaFloat32 QVar10;
  undefined1 in_ZMM0 [64];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  QRgbaFloat32 local_198;
  int local_17c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 uStack_88;
  __m128 vsr;
  float a;
  __m128 vsa;
  __m128 vsf;
  int i;
  __m128 zero;
  __m128 *s;
  quint64 *d;
  QDitherInfo *param_5_local;
  QList<unsigned_int> *param_4_local;
  
  vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
  auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
  QVar2 = (QRgbaFloat32)vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
  QVar10 = QVar2;
  for (local_17c = 0; local_17c < count; local_17c = local_17c + 1) {
    vpcmpeqd_avx((undefined1  [16])QVar10,(undefined1  [16])QVar10);
    pQVar9 = src + local_17c;
    uVar3 = pQVar9->r;
    uVar4 = pQVar9->g;
    uVar5 = pQVar9->b;
    uVar6 = pQVar9->a;
    local_198 = *pQVar9;
    local_1a8 = CONCAT44(uVar6,uVar6);
    uStack_1a0._0_4_ = uVar6;
    uStack_1a0._4_4_ = uVar6;
    if ((((float)uVar6 != 1.0) || (NAN((float)uVar6))) &&
       (((float)uVar6 != 0.0 || (local_198 = QVar2, NAN((float)uVar6))))) {
      vpcmpeqd_avx(ZEXT416((uint)uVar6),ZEXT416((uint)uVar6));
      auVar8._8_8_ = uStack_1a0;
      auVar8._0_8_ = local_1a8;
      auVar1 = vrcpps_avx(auVar8);
      local_98 = auVar1._0_4_;
      fStack_94 = auVar1._4_4_;
      fStack_90 = auVar1._8_4_;
      fStack_8c = auVar1._12_4_;
      auVar7._4_4_ = fStack_94 + fStack_94;
      auVar7._0_4_ = local_98 + local_98;
      auVar7._8_4_ = fStack_90 + fStack_90;
      auVar7._12_4_ = fStack_8c + fStack_8c;
      auVar1._4_4_ = fStack_94 * fStack_94 * (float)uVar6;
      auVar1._0_4_ = local_98 * local_98 * (float)uVar6;
      auVar1._8_4_ = fStack_90 * fStack_90 * (float)uVar6;
      auVar1._12_4_ = fStack_8c * fStack_8c * (float)uVar6;
      auVar1 = vsubps_avx(auVar7,auVar1);
      local_128 = auVar1._0_4_;
      fStack_124 = auVar1._4_4_;
      fStack_120 = auVar1._8_4_;
      fStack_11c = auVar1._12_4_;
      local_198.g = (float)uVar4 * fStack_124;
      local_198.r = (float)uVar3 * local_128;
      local_198.b = (float)uVar5 * fStack_120;
      local_198.a = (float)uVar6 * fStack_11c;
      local_198 = (QRgbaFloat32)vinsertps_avx((undefined1  [16])local_198,ZEXT416(0x3f800000),0x30);
    }
    QVar10 = (QRgbaFloat32)vcvtps2ph_f16c((undefined1  [16])local_198,0);
    uStack_88 = QVar10._0_8_;
    *(undefined8 *)(dest + (long)local_17c * 8 + (long)index * 8) = uStack_88;
  }
  return;
}

Assistant:

void QT_FASTCALL storeRGBX16FFromRGBA32F_avx2(uchar *dest, const QRgbaFloat32 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    quint64 *d = reinterpret_cast<quint64 *>(dest) + index;
    const __m128 *s = reinterpret_cast<const __m128 *>(src);
    const __m128 zero = _mm_set_ps(1.0f, 0.0f, 0.0f, 0.0f);
    for (int i = 0; i < count; ++i) {
        __m128 vsf = _mm_loadu_ps(reinterpret_cast<const float *>(s + i));
        const __m128 vsa = _mm_permute_ps(vsf, _MM_SHUFFLE(3, 3, 3, 3));
        const float a = _mm_cvtss_f32(vsa);
        if (a == 1.0f)
        { }
        else if (a == 0.0f)
            vsf = zero;
        else {
            __m128 vsr = _mm_rcp_ps(vsa);
            vsr = _mm_sub_ps(_mm_add_ps(vsr, vsr), _mm_mul_ps(vsr, _mm_mul_ps(vsr, vsa)));
            vsf = _mm_mul_ps(vsf, vsr);
            vsf = _mm_insert_ps(vsf, _mm_set_ss(1.0f), 0x30);
        }
        _mm_storel_epi64((__m128i *)(d + i), _mm_cvtps_ph(vsf, 0));
    }
}